

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseNotationDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  notationDeclSAXFunc p_Var3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  char *pcVar7;
  xmlChar *Pubid;
  xmlChar *local_28;
  
  pxVar2 = ctxt->input;
  pxVar5 = pxVar2->cur;
  if ((*pxVar5 == '<') && (pxVar5[1] == '!')) {
    pxVar2->cur = pxVar5 + 2;
    pxVar2->col = pxVar2->col + 2;
    if (pxVar5[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar2 = ctxt->input;
    pxVar5 = pxVar2->cur;
    if ((((*pxVar5 == 'N') && (pxVar5[1] == 'O')) && (pxVar5[2] == 'T')) &&
       (((pxVar5[3] == 'A' && (pxVar5[4] == 'T')) &&
        ((pxVar5[5] == 'I' && ((pxVar5[6] == 'O' && (pxVar5[7] == 'N')))))))) {
      iVar1 = pxVar2->id;
      pxVar2->cur = pxVar5 + 8;
      pxVar2->col = pxVar2->col + 8;
      if (pxVar5[8] == '\0') {
        xmlParserGrow(ctxt);
      }
      iVar4 = xmlSkipBlankCharsPE(ctxt);
      if (iVar4 == 0) {
        pcVar7 = "Space required after \'<!NOTATION\'\n";
      }
      else {
        pxVar5 = xmlParseName(ctxt);
        if (pxVar5 == (xmlChar *)0x0) {
          xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
          return;
        }
        pxVar6 = xmlStrchr(pxVar5,':');
        if (pxVar6 != (xmlChar *)0x0) {
          ctxt->nsWellFormed = 0;
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_NAMESPACE,XML_NS_ERR_COLON,XML_ERR_ERROR,pxVar5,
                     (xmlChar *)0x0,(xmlChar *)0x0,0,
                     "colons are forbidden from notation names \'%s\'\n",pxVar5,0,0);
        }
        iVar4 = xmlSkipBlankCharsPE(ctxt);
        if (iVar4 != 0) {
          pxVar6 = xmlParseExternalID(ctxt,&local_28,0);
          xmlSkipBlankCharsPE(ctxt);
          if (*ctxt->input->cur == '>') {
            if (iVar1 != ctxt->input->id) {
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                         "Notation declaration doesn\'t start and stop in the same entity\n");
            }
            xmlNextChar(ctxt);
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
               (p_Var3 = ctxt->sax->notationDecl, p_Var3 != (notationDeclSAXFunc)0x0)) {
              (*p_Var3)(ctxt->userData,pxVar5,local_28,pxVar6);
            }
          }
          else {
            xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
          }
          if (pxVar6 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar6);
          }
          if (local_28 == (xmlChar *)0x0) {
            return;
          }
          (*xmlFree)(local_28);
          return;
        }
        pcVar7 = "Space required after the NOTATION name\'\n";
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar7);
    }
  }
  return;
}

Assistant:

void
xmlParseNotationDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *Pubid;
    xmlChar *Systemid;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    if (CMP8(CUR_PTR, 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	int inputid = ctxt->input->id;
	SKIP(8);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!NOTATION'\n");
	    return;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	    return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from notation names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		     "Space required after the NOTATION name'\n");
	    return;
	}

	/*
	 * Parse the IDs.
	 */
	Systemid = xmlParseExternalID(ctxt, &Pubid, 0);
	SKIP_BLANKS_PE;

	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Notation declaration doesn't start and stop"
                               " in the same entity\n");
	    }
	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->notationDecl != NULL))
		ctxt->sax->notationDecl(ctxt->userData, name, Pubid, Systemid);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
	}
	if (Systemid != NULL) xmlFree(Systemid);
	if (Pubid != NULL) xmlFree(Pubid);
    }
}